

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O1

size_t ZSTD_compressContinue_internal
                 (ZSTD_CCtx *cctx,void *dst,size_t dstCapacity,void *src,size_t srcSize,U32 frame,
                 U32 lastFrameChunk)

{
  ZSTD_matchState_t *ms;
  seqStore_t *origSeqStore;
  long lVar1;
  BYTE BVar2;
  U32 UVar3;
  uint uVar4;
  ZSTD_strategy ZVar5;
  BYTE *pBVar6;
  ZSTD_compressedBlockState_t *pZVar7;
  unsigned_long_long uVar8;
  ushort uVar9;
  seqDef *psVar10;
  size_t sVar11;
  U32 UVar12;
  int iVar13;
  uint uVar14;
  size_t err_code;
  ulong uVar15;
  size_t sVar16;
  size_t sVar17;
  byte bVar18;
  short sVar19;
  long lVar20;
  long lVar21;
  BYTE *ip;
  BYTE *pBVar22;
  uint uVar23;
  long lVar24;
  seqStore_t *psVar25;
  seqStore_t *psVar26;
  size_t sVar27;
  size_t srcSize_00;
  size_t err_code_1;
  ulong dstCapacity_00;
  size_t srcSize_01;
  BYTE *pBVar28;
  size_t err_code_9;
  size_t sVar29;
  seqDef *psVar30;
  bool bVar31;
  byte bVar32;
  BYTE *op;
  BYTE *local_478;
  size_t local_448;
  repcodes_t dRep;
  ulong local_420;
  long local_408;
  repcodes_t local_400;
  ZSTD_cwksp *local_3f0;
  seqStore_t currSeqStore;
  seqStore_t nextSeqStore;
  U32 partitions [196];
  
  bVar32 = 0;
  if (cctx->stage == ZSTDcs_created) {
    uVar15 = 0xffffffffffffffc4;
  }
  else {
    if (cctx->stage == ZSTDcs_init && frame != 0) {
      local_448 = ZSTD_writeFrameHeader
                            (dst,dstCapacity,&cctx->appliedParams,cctx->pledgedSrcSizePlusOne - 1,
                             cctx->dictID);
      if (0xffffffffffffff88 < local_448) {
        return local_448;
      }
      dstCapacity = dstCapacity - local_448;
      local_478 = (BYTE *)((long)dst + local_448);
      cctx->stage = ZSTDcs_ongoing;
    }
    else {
      local_448 = 0;
      local_478 = (BYTE *)dst;
    }
    uVar15 = local_448;
    if (srcSize != 0) {
      pBVar6 = (cctx->blockState).matchState.window.nextSrc;
      bVar31 = (cctx->blockState).matchState.forceNonContiguous != 0;
      if (bVar31 || pBVar6 != (BYTE *)src) {
        pBVar22 = (cctx->blockState).matchState.window.base;
        lVar20 = (long)pBVar6 - (long)pBVar22;
        UVar3 = (cctx->blockState).matchState.window.dictLimit;
        (cctx->blockState).matchState.window.lowLimit = UVar3;
        UVar12 = (U32)lVar20;
        (cctx->blockState).matchState.window.dictLimit = UVar12;
        (cctx->blockState).matchState.window.dictBase = pBVar22;
        (cctx->blockState).matchState.window.base = (BYTE *)((long)src - lVar20);
        if (UVar12 - UVar3 < 8) {
          (cctx->blockState).matchState.window.lowLimit = UVar12;
        }
      }
      pBVar22 = (BYTE *)(srcSize + (long)src);
      (cctx->blockState).matchState.window.nextSrc = pBVar22;
      pBVar28 = (cctx->blockState).matchState.window.dictBase;
      uVar4 = (cctx->blockState).matchState.window.dictLimit;
      if (src < pBVar28 + uVar4 && pBVar28 + (cctx->blockState).matchState.window.lowLimit < pBVar22
         ) {
        uVar23 = (uint)((long)pBVar22 - (long)pBVar28);
        if ((long)(ulong)uVar4 < (long)pBVar22 - (long)pBVar28) {
          uVar23 = uVar4;
        }
        (cctx->blockState).matchState.window.lowLimit = uVar23;
      }
      if (bVar31 || pBVar6 != (BYTE *)src) {
        (cctx->blockState).matchState.forceNonContiguous = 0;
        (cctx->blockState).matchState.nextToUpdate = (cctx->blockState).matchState.window.dictLimit;
      }
      if ((cctx->appliedParams).ldmParams.enableLdm != 0) {
        pBVar6 = (cctx->ldmState).window.nextSrc;
        if (pBVar6 != (BYTE *)src) {
          pBVar28 = (cctx->ldmState).window.base;
          lVar20 = (long)pBVar6 - (long)pBVar28;
          UVar3 = (cctx->ldmState).window.dictLimit;
          (cctx->ldmState).window.lowLimit = UVar3;
          UVar12 = (U32)lVar20;
          (cctx->ldmState).window.dictLimit = UVar12;
          (cctx->ldmState).window.dictBase = pBVar28;
          (cctx->ldmState).window.base = (BYTE *)((long)src - lVar20);
          if (UVar12 - UVar3 < 8) {
            (cctx->ldmState).window.lowLimit = UVar12;
          }
        }
        (cctx->ldmState).window.nextSrc = pBVar22;
        pBVar6 = (cctx->ldmState).window.dictBase;
        uVar4 = (cctx->ldmState).window.dictLimit;
        if (src < pBVar6 + uVar4 && pBVar6 + (cctx->ldmState).window.lowLimit < pBVar22) {
          uVar23 = (uint)((long)pBVar22 - (long)pBVar6);
          if ((long)(ulong)uVar4 < (long)pBVar22 - (long)pBVar6) {
            uVar23 = uVar4;
          }
          (cctx->ldmState).window.lowLimit = uVar23;
        }
      }
      ms = &(cctx->blockState).matchState;
      if (frame == 0) {
        ZSTD_overflowCorrectIfNeeded(ms,&cctx->workspace,&cctx->appliedParams,src,pBVar22);
        uVar15 = ZSTD_compressBlock_internal(cctx,local_478,dstCapacity,src,srcSize,0);
      }
      else {
        uVar4 = (cctx->appliedParams).cParams.windowLog;
        srcSize_00 = cctx->blockSize;
        if ((cctx->appliedParams).fParams.checksumFlag != 0) {
          XXH64_update(&cctx->xxhState,src,srcSize);
        }
        local_3f0 = &cctx->workspace;
        origSeqStore = &cctx->seqStore;
        op = local_478;
        sVar27 = srcSize;
        sVar29 = srcSize;
        do {
          if (sVar27 == 0) {
            if ((lastFrameChunk != 0) && (local_478 < op)) {
              cctx->stage = ZSTDcs_ending;
            }
            uVar15 = (long)op - (long)local_478;
            break;
          }
          uVar14 = 0;
          uVar23 = lastFrameChunk & 1;
          if (srcSize_00 < sVar27) {
            uVar23 = uVar14;
          }
          if (dstCapacity < 6) {
            uVar15 = 0xffffffffffffffba;
            goto LAB_0069fb05;
          }
          if (sVar27 < srcSize_00) {
            srcSize_00 = sVar27;
          }
          pBVar6 = (BYTE *)((long)src + srcSize_00);
          ZSTD_overflowCorrectIfNeeded(ms,local_3f0,&cctx->appliedParams,src,pBVar6);
          if ((cctx->blockState).matchState.loadedDictEnd + (1 << ((byte)uVar4 & 0x1f)) <
              (uint)((int)pBVar6 - *(int *)&(cctx->blockState).matchState.window.base)) {
            (cctx->blockState).matchState.loadedDictEnd = 0;
            (cctx->blockState).matchState.dictMatchState = (ZSTD_matchState_t *)0x0;
          }
          uVar14 = (cctx->blockState).matchState.window.lowLimit;
          if ((cctx->blockState).matchState.nextToUpdate < uVar14) {
            (cctx->blockState).matchState.nextToUpdate = uVar14;
          }
          uVar9 = (ushort)uVar23;
          sVar19 = (short)srcSize_00;
          if ((cctx->appliedParams).targetCBlockSize == 0) {
            if ((cctx->appliedParams).splitBlocks == 0) {
              uVar15 = ZSTD_compressBlock_internal(cctx,op + 3,dstCapacity - 3,src,srcSize_00,1);
              if (uVar15 < 0xffffffffffffff89) {
                if (uVar15 == 1) {
                  sVar19 = 2;
                  sVar17 = srcSize_00;
                }
                else {
                  if (uVar15 == 0) {
                    uVar15 = 0xffffffffffffffba;
                    if (srcSize_00 + 3 <= dstCapacity) {
                      *(ushort *)op = uVar9 + sVar19 * 8;
                      op[2] = (BYTE)(srcSize_00 >> 0xd);
                      memcpy(op + 3,src,srcSize_00);
                      uVar15 = srcSize_00 + 3;
                    }
                    if (0xffffffffffffff88 < uVar15) goto LAB_0069faa7;
                    goto LAB_0069fae3;
                  }
                  sVar19 = 4;
                  sVar17 = uVar15;
                }
                *(ushort *)op = sVar19 + (short)sVar17 * 8 | uVar9;
                op[2] = (BYTE)(sVar17 >> 0xd);
                uVar15 = uVar15 + 3;
                goto LAB_0069fae3;
              }
              uVar14 = 0;
            }
            else {
              uVar15 = ZSTD_buildSeqStore(cctx,src,srcSize_00);
              sVar17 = dstCapacity;
              if (uVar15 < 0xffffffffffffff89) {
                if (uVar15 == 1) {
                  pZVar7 = (cctx->blockState).prevCBlock;
                  if ((pZVar7->entropy).fse.offcode_repeatMode == FSE_repeat_valid) {
                    (pZVar7->entropy).fse.offcode_repeatMode = FSE_repeat_check;
                  }
                  uVar15 = srcSize_00 + 3;
                  if (dstCapacity < uVar15) {
                    uVar15 = 0xffffffffffffffba;
                  }
                  else {
                    *(ushort *)op = uVar9 + sVar19 * 8;
                    op[2] = (BYTE)(srcSize_00 >> 0xd);
                    memcpy(op + 3,src,srcSize_00);
                  }
                  bVar31 = false;
                }
                else {
                  bVar31 = true;
                  sVar17 = (ulong)((long)(cctx->seqStore).sequences -
                                  (long)(cctx->seqStore).sequencesStart) >> 3;
                }
              }
              else {
                bVar31 = false;
              }
              if (bVar31) {
                nextSeqStore.sequencesStart = (seqDef *)partitions;
                nextSeqStore.sequences = (seqDef *)0x0;
                if (4 < (uint)sVar17) {
                  ZSTD_deriveBlockSplitsHelper
                            ((seqStoreSplits *)&nextSeqStore,0,sVar17 & 0xffffffff,cctx,origSeqStore
                            );
                  (&(nextSeqStore.sequencesStart)->offset)[(long)nextSeqStore.sequences] =
                       (uint)sVar17;
                }
                psVar10 = nextSeqStore.sequences;
                pZVar7 = (cctx->blockState).prevCBlock;
                dRep.rep[2] = pZVar7->rep[2];
                dRep.rep._0_8_ = *(undefined8 *)pZVar7->rep;
                local_400.rep._0_8_ = *(undefined8 *)pZVar7->rep;
                local_400.rep[2] = pZVar7->rep[2];
                if (nextSeqStore.sequences == (seqDef *)0x0) {
                  uVar15 = ZSTD_compressSeqStore_singleBlock
                                     (cctx,origSeqStore,&dRep,&local_400,op,dstCapacity,src,
                                      srcSize_00,uVar23,0);
                }
                else {
                  ZSTD_deriveSeqStoreChunk(&currSeqStore,origSeqStore,0,(ulong)partitions[0]);
                  local_420 = 0;
                  psVar30 = (seqDef *)0x0;
                  local_408 = 0;
                  pBVar22 = op;
                  dstCapacity_00 = dstCapacity;
                  pBVar28 = (BYTE *)src;
                  do {
                    if ((long)currSeqStore.sequences - (long)currSeqStore.sequencesStart == 0) {
                      lVar20 = 0;
                    }
                    else {
                      lVar24 = (long)currSeqStore.sequences - (long)currSeqStore.sequencesStart >> 3
                      ;
                      lVar20 = 0;
                      uVar15 = 0;
                      do {
                        lVar21 = lVar20 + (ulong)currSeqStore.sequencesStart[uVar15].litLength;
                        lVar20 = lVar20 + 0x10000 +
                                 (ulong)currSeqStore.sequencesStart[uVar15].litLength;
                        if (currSeqStore.longLengthType != ZSTD_llt_literalLength) {
                          lVar20 = lVar21;
                        }
                        if (currSeqStore.longLengthPos != uVar15) {
                          lVar20 = lVar21;
                        }
                        uVar15 = uVar15 + 1;
                      } while (lVar24 + (ulong)(lVar24 == 0) != uVar15);
                    }
                    if ((long)currSeqStore.sequences - (long)currSeqStore.sequencesStart == 0) {
                      lVar24 = 0;
                    }
                    else {
                      lVar21 = (long)currSeqStore.sequences - (long)currSeqStore.sequencesStart >> 3
                      ;
                      lVar24 = 0;
                      uVar15 = 0;
                      do {
                        lVar1 = lVar24 + 3 + (ulong)currSeqStore.sequencesStart[uVar15].matchLength;
                        lVar24 = lVar24 + 0x10003 +
                                 (ulong)currSeqStore.sequencesStart[uVar15].matchLength;
                        if (currSeqStore.longLengthType != ZSTD_llt_matchLength) {
                          lVar24 = lVar1;
                        }
                        if (currSeqStore.longLengthPos != uVar15) {
                          lVar24 = lVar1;
                        }
                        uVar15 = uVar15 + 1;
                      } while (lVar21 + (ulong)(lVar21 == 0) != uVar15);
                    }
                    srcSize_01 = lVar24 + lVar20;
                    local_408 = local_408 + srcSize_01;
                    if (psVar30 == psVar10) {
                      srcSize_01 = (srcSize_01 + srcSize_00) - local_408;
                      uVar14 = uVar23;
                    }
                    else {
                      ZSTD_deriveSeqStoreChunk
                                (&nextSeqStore,origSeqStore,(ulong)partitions[(long)psVar30],
                                 (ulong)partitions[(long)((long)&psVar30->offset + 1)]);
                      uVar14 = 0;
                    }
                    sVar16 = ZSTD_compressSeqStore_singleBlock
                                       (cctx,&currSeqStore,&dRep,&local_400,pBVar22,dstCapacity_00,
                                        pBVar28,srcSize_01,uVar14,1);
                    sVar11 = sVar16;
                    if (sVar16 < 0xffffffffffffff89) {
                      pBVar28 = pBVar28 + srcSize_01;
                      pBVar22 = pBVar22 + sVar16;
                      dstCapacity_00 = dstCapacity_00 - sVar16;
                      local_420 = local_420 + sVar16;
                      psVar25 = &nextSeqStore;
                      psVar26 = &currSeqStore;
                      for (lVar20 = 10; sVar11 = sVar17, lVar20 != 0; lVar20 = lVar20 + -1) {
                        psVar26->sequencesStart = psVar25->sequencesStart;
                        psVar25 = (seqStore_t *)((long)psVar25 + (ulong)bVar32 * -0x10 + 8);
                        psVar26 = (seqStore_t *)((long)psVar26 + (ulong)bVar32 * -0x10 + 8);
                      }
                    }
                    sVar17 = sVar11;
                    uVar15 = sVar17;
                    if (0xffffffffffffff88 < sVar16) goto LAB_0069fa9b;
                    psVar30 = (seqDef *)((long)&psVar30->offset + 1);
                  } while (psVar30 <= psVar10);
                  pZVar7 = (cctx->blockState).prevCBlock;
                  pZVar7->rep[2] = dRep.rep[2];
                  *(undefined8 *)pZVar7->rep = dRep.rep._0_8_;
                  uVar15 = local_420;
                }
              }
LAB_0069fa9b:
              if (uVar15 < 0xffffffffffffff89) {
LAB_0069fae3:
                sVar27 = sVar27 - srcSize_00;
                op = op + uVar15;
                dstCapacity = dstCapacity - uVar15;
                cctx->isFirstBlock = 0;
                uVar14 = 1;
                src = pBVar6;
                uVar15 = sVar29;
              }
              else {
LAB_0069faa7:
                uVar14 = 0;
              }
            }
          }
          else {
            uVar15 = ZSTD_buildSeqStore(cctx,src,srcSize_00);
            if (uVar15 < 0xffffffffffffff89) {
              if (uVar15 == 0) {
                if ((((cctx->isFirstBlock == 0) &&
                     ((ulong)((long)(cctx->seqStore).sequences -
                             (long)(cctx->seqStore).sequencesStart) < 0x20)) &&
                    ((ulong)((long)(cctx->seqStore).lit - (long)(cctx->seqStore).litStart) < 10)) &&
                   (iVar13 = ZSTD_isRLE((BYTE *)src,srcSize_00), iVar13 != 0)) {
                  BVar2 = *src;
                  *(ushort *)op = uVar9 + sVar19 * 8 + 2;
                  op[2] = (BYTE)(srcSize_00 >> 0xd);
                  op[3] = BVar2;
                  uVar15 = 4;
                }
                else {
                  uVar15 = ZSTD_compressSuperBlock(cctx,op,dstCapacity,src,srcSize_00,uVar23);
                  if (uVar15 == 0xffffffffffffffba) goto LAB_0069f433;
                  if (uVar15 < 0xffffffffffffff89) {
                    ZVar5 = (cctx->appliedParams).cParams.strategy;
                    bVar18 = (char)ZVar5 - 1;
                    if (ZVar5 < ZSTD_btultra) {
                      bVar18 = 6;
                    }
                    if ((uVar15 == 0) ||
                       ((srcSize_00 - (srcSize_00 >> (bVar18 & 0x3f))) + 1 <= uVar15))
                    goto LAB_0069f433;
                    pZVar7 = (cctx->blockState).prevCBlock;
                    (cctx->blockState).prevCBlock = (cctx->blockState).nextCBlock;
                    (cctx->blockState).nextCBlock = pZVar7;
                  }
                }
              }
              else {
LAB_0069f433:
                uVar15 = 0xffffffffffffffba;
                if (srcSize_00 + 3 <= dstCapacity) {
                  *(ushort *)op = uVar9 + sVar19 * 8;
                  op[2] = (BYTE)(srcSize_00 >> 0xd);
                  memcpy(op + 3,src,srcSize_00);
                  uVar15 = srcSize_00 + 3;
                }
              }
              if ((uVar15 < 0xffffffffffffff89) &&
                 (pZVar7 = (cctx->blockState).prevCBlock,
                 (pZVar7->entropy).fse.offcode_repeatMode == FSE_repeat_valid)) {
                (pZVar7->entropy).fse.offcode_repeatMode = FSE_repeat_check;
              }
            }
            if (uVar15 < 0xffffffffffffff89) goto LAB_0069fae3;
            uVar14 = 0;
          }
LAB_0069fb05:
          sVar29 = uVar15;
        } while ((char)uVar14 != '\0');
      }
      if (uVar15 < 0xffffffffffffff89) {
        uVar8 = cctx->consumedSrcSize;
        cctx->consumedSrcSize = uVar8 + srcSize;
        local_448 = uVar15 + local_448;
        cctx->producedCSize = cctx->producedCSize + local_448;
        uVar15 = 0xffffffffffffffb8;
        if (uVar8 + srcSize + 1 <= cctx->pledgedSrcSizePlusOne) {
          uVar15 = local_448;
        }
        if (cctx->pledgedSrcSizePlusOne == 0) {
          uVar15 = local_448;
        }
      }
    }
  }
  return uVar15;
}

Assistant:

static size_t ZSTD_compressContinue_internal (ZSTD_CCtx* cctx,
                              void* dst, size_t dstCapacity,
                        const void* src, size_t srcSize,
                               U32 frame, U32 lastFrameChunk)
{
    ZSTD_matchState_t* const ms = &cctx->blockState.matchState;
    size_t fhSize = 0;

    DEBUGLOG(5, "ZSTD_compressContinue_internal, stage: %u, srcSize: %u",
                cctx->stage, (unsigned)srcSize);
    RETURN_ERROR_IF(cctx->stage==ZSTDcs_created, stage_wrong,
                    "missing init (ZSTD_compressBegin)");

    if (frame && (cctx->stage==ZSTDcs_init)) {
        fhSize = ZSTD_writeFrameHeader(dst, dstCapacity, &cctx->appliedParams,
                                       cctx->pledgedSrcSizePlusOne-1, cctx->dictID);
        FORWARD_IF_ERROR(fhSize, "ZSTD_writeFrameHeader failed");
        assert(fhSize <= dstCapacity);
        dstCapacity -= fhSize;
        dst = (char*)dst + fhSize;
        cctx->stage = ZSTDcs_ongoing;
    }

    if (!srcSize) return fhSize;  /* do not generate an empty block if no input */

    if (!ZSTD_window_update(&ms->window, src, srcSize, ms->forceNonContiguous)) {
        ms->forceNonContiguous = 0;
        ms->nextToUpdate = ms->window.dictLimit;
    }
    if (cctx->appliedParams.ldmParams.enableLdm) {
        ZSTD_window_update(&cctx->ldmState.window, src, srcSize, /* forceNonContiguous */ 0);
    }

    if (!frame) {
        /* overflow check and correction for block mode */
        ZSTD_overflowCorrectIfNeeded(
            ms, &cctx->workspace, &cctx->appliedParams,
            src, (BYTE const*)src + srcSize);
    }

    DEBUGLOG(5, "ZSTD_compressContinue_internal (blockSize=%u)", (unsigned)cctx->blockSize);
    {   size_t const cSize = frame ?
                             ZSTD_compress_frameChunk (cctx, dst, dstCapacity, src, srcSize, lastFrameChunk) :
                             ZSTD_compressBlock_internal (cctx, dst, dstCapacity, src, srcSize, 0 /* frame */);
        FORWARD_IF_ERROR(cSize, "%s", frame ? "ZSTD_compress_frameChunk failed" : "ZSTD_compressBlock_internal failed");
        cctx->consumedSrcSize += srcSize;
        cctx->producedCSize += (cSize + fhSize);
        assert(!(cctx->appliedParams.fParams.contentSizeFlag && cctx->pledgedSrcSizePlusOne == 0));
        if (cctx->pledgedSrcSizePlusOne != 0) {  /* control src size */
            ZSTD_STATIC_ASSERT(ZSTD_CONTENTSIZE_UNKNOWN == (unsigned long long)-1);
            RETURN_ERROR_IF(
                cctx->consumedSrcSize+1 > cctx->pledgedSrcSizePlusOne,
                srcSize_wrong,
                "error : pledgedSrcSize = %u, while realSrcSize >= %u",
                (unsigned)cctx->pledgedSrcSizePlusOne-1,
                (unsigned)cctx->consumedSrcSize);
        }
        return cSize + fhSize;
    }
}